

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Algorithm_Base.cpp
# Opt level: O2

void __thiscall
OSTEI_VRR_Algorithm_Base::OSTEI_VRR_Algorithm_Base
          (OSTEI_VRR_Algorithm_Base *this,OSTEI_GeneratorInfo *info)

{
  _Rb_tree_header *p_Var1;
  
  this->_vptr_OSTEI_VRR_Algorithm_Base = (_func_int **)&PTR__OSTEI_VRR_Algorithm_Base_0014fc38;
  OSTEI_GeneratorInfo::OSTEI_GeneratorInfo(&this->info_,info);
  p_Var1 = &(this->options_)._M_t._M_impl.super__Rb_tree_header;
  (this->options_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->options_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->options_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->options_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->options_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->vrrmap_)._M_t._M_impl.super__Rb_tree_header;
  (this->vrrmap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->vrrmap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->vrrmap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->vrrmap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->vrrmap_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->vrrmreq_max_)._M_t._M_impl.super__Rb_tree_header;
  (this->vrrmreq_max_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->vrrmreq_max_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->vrrmreq_max_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->vrrmreq_max_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->qamint_2p_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->qamint_2p_)._M_t._M_impl.super__Rb_tree_header;
  (this->qamint_2p_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->vrrmreq_max_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->amorder_).super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->amorder_).super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->amorder_).super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->qamint_2p_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->qamint_2p_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->qamint_2p_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->qamint_2q_)._M_t._M_impl.super__Rb_tree_header;
  (this->qamint_2q_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->qamint_2q_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->qamint_2q_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->qamint_2q_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->qamint_2q_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->qamint_2pq_)._M_t._M_impl.super__Rb_tree_header;
  (this->qamint_2pq_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->qamint_2pq_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->qamint_2pq_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->qamint_2pq_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->qamint_2pq_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->allam_)._M_t._M_impl.super__Rb_tree_header;
  (this->allam_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->allam_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->allam_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->allam_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->allam_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

OSTEI_VRR_Algorithm_Base::OSTEI_VRR_Algorithm_Base(const OSTEI_GeneratorInfo & info)
    : info_(info)
{
}